

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_util_assertion.hpp
# Opt level: O1

AssertionResult *
iuutil::CmpHelperSTRLNEQ
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,size_t len1,string *val2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  AssertionResult *pAVar3;
  size_t len2;
  size_t local_60;
  size_t local_58;
  char *local_50;
  char *local_48;
  AssertionResult local_40;
  
  local_60 = val2->_M_string_length;
  if (local_60 == len1) {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  else {
    paVar1 = &local_40.m_message.field_2;
    local_40.m_message._M_string_length = 0;
    local_40.m_message.field_2._M_local_buf[0] = '\0';
    local_40.m_result = false;
    local_58 = len1;
    local_50 = expr2;
    local_48 = expr1;
    local_40.m_message._M_dataplus._M_p = (pointer)paVar1;
    pAVar3 = iutest::AssertionResult::operator<<(&local_40,(char (*) [18])"error: Value of: ");
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,&local_48);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char (*) [12])" == strlen(");
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,&local_50);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char (*) [2])0x12b220);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char (*) [12])"\n  Actual: ");
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,val2);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char (*) [4])" : ");
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,&local_60);
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,(char (*) [12])"\nExpected: ");
    pAVar3 = iutest::AssertionResult::operator<<(pAVar3,&local_58);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar2 = (pAVar3->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + (pAVar3->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar3->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_40.m_message._M_dataplus._M_p,
                      CONCAT71(local_40.m_message.field_2._M_allocated_capacity._1_7_,
                               local_40.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::iutest::AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperSTRLNEQ(const char* expr1, const char* expr2
                                        , size_t len1, const ::std::string& val2)
{
    const size_t len2 = val2.length();
    if( len2 == len1 )
    {
        return ::iutest::AssertionSuccess();
    }
    return ::iutest::AssertionFailure() << "error: Value of: " << expr1 << " == strlen(" << expr2 << ")"
        << "\n  Actual: " << val2 << " : " << len2 << "\nExpected: " << len1;
}